

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_all_apis.cpp
# Opt level: O0

void __thiscall APITests::test_setup_all1(APITests *this)

{
  bool bVar1;
  iterator element;
  reference piVar2;
  int *in_RDI;
  int pin;
  iterator __end1;
  iterator __begin1;
  vector<int,_std::allocator<int>_> *__range1;
  vector<int,_std::allocator<int>_> pins;
  vector<int,_std::allocator<int>_> *in_stack_ffffffffffffff88;
  undefined7 in_stack_ffffffffffffff90;
  undefined1 in_stack_ffffffffffffff97;
  vector<int,_std::allocator<int>_> *this_00;
  undefined4 in_stack_ffffffffffffffa8;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> in_stack_ffffffffffffffb8;
  vector<int,_std::allocator<int>_> *in_stack_ffffffffffffffc0;
  vector<int,_std::allocator<int>_> local_28;
  
  GPIO::setmode(BOARD);
  local_28.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  local_28.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  local_28.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  this_00 = &local_28;
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x13cdfa);
  std::vector<int,_std::allocator<int>_>::size((vector<int,_std::allocator<int>_> *)(in_RDI + 0x28))
  ;
  std::vector<int,_std::allocator<int>_>::reserve
            (in_stack_ffffffffffffffc0,(size_type)in_stack_ffffffffffffffb8._M_current);
  std::vector<int,_std::allocator<int>_>::begin(in_stack_ffffffffffffff88);
  element = std::vector<int,_std::allocator<int>_>::end(in_stack_ffffffffffffff88);
  while (bVar1 = __gnu_cxx::operator!=
                           ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                            CONCAT17(in_stack_ffffffffffffff97,in_stack_ffffffffffffff90),
                            (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                            in_stack_ffffffffffffff88), bVar1) {
    piVar2 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator*
                       ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                        &stack0xffffffffffffffb8);
    in_stack_ffffffffffffff97 =
         is_in<int&,std::vector<int,std::allocator<int>>&>
                   (element._M_current,
                    (vector<int,_std::allocator<int>_> *)CONCAT44(*piVar2,in_stack_ffffffffffffffa8)
                   );
    if (!(bool)in_stack_ffffffffffffff97) {
      std::vector<int,std::allocator<int>>::emplace_back<int&>(this_00,in_RDI);
    }
    __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
              ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
               &stack0xffffffffffffffb8);
  }
  GPIO::setup((vector *)&local_28,IN,-1);
  GPIO::cleanup();
  std::vector<int,_std::allocator<int>_>::~vector(this_00);
  return;
}

Assistant:

void test_setup_all1()
    {
        GPIO::setmode(GPIO::BOARD);
        std::vector<int> pins{};
        pins.reserve(all_board_pins.size());

        for (auto pin : all_board_pins)
        {
            if (is_in(pin, pin_data.unimplemented_pins))
                continue;

            pins.emplace_back(pin);
        }

        GPIO::setup(pins, GPIO::IN);
        GPIO::cleanup();
    }